

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_glfw.cpp
# Opt level: O3

void ImGui_ImplGlfw_UpdateMonitors(void)

{
  ImVec2 *pIVar1;
  int iVar2;
  ImGuiPlatformIO *pIVar3;
  GLFWmonitor **ppGVar4;
  ImGuiPlatformMonitor *pIVar5;
  GLFWvidmode *pGVar6;
  ImGuiPlatformMonitor *pIVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  float fVar11;
  int y;
  int x;
  int monitors_count;
  float x_scale;
  int h;
  int w;
  float y_scale;
  uint local_c8;
  uint local_c4;
  int local_c0;
  float local_bc;
  float local_b8;
  uint local_b4;
  uint local_b0;
  float local_ac;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined8 local_48;
  undefined8 uStack_40;
  
  pIVar3 = ImGui::GetPlatformIO();
  local_c0 = 0;
  ppGVar4 = glfwGetMonitors(&local_c0);
  if ((pIVar3->Monitors).Capacity < 0) {
    pIVar5 = (ImGuiPlatformMonitor *)ImGui::MemAlloc(0);
    pIVar7 = (pIVar3->Monitors).Data;
    if (pIVar7 != (ImGuiPlatformMonitor *)0x0) {
      memcpy(pIVar5,pIVar7,(long)(pIVar3->Monitors).Size * 0x24);
      ImGui::MemFree((pIVar3->Monitors).Data);
    }
    (pIVar3->Monitors).Data = pIVar5;
    (pIVar3->Monitors).Capacity = 0;
  }
  (pIVar3->Monitors).Size = 0;
  if (0 < local_c0) {
    lVar8 = 0;
    do {
      glfwGetMonitorPos(ppGVar4[lVar8],(int *)&local_c4,(int *)&local_c8);
      pGVar6 = glfwGetVideoMode(ppGVar4[lVar8]);
      local_48._0_4_ = pGVar6->width;
      local_48._4_4_ = pGVar6->height;
      uStack_40 = 0;
      local_68 = ZEXT416(local_c8);
      local_58 = ZEXT416(local_c4);
      glfwGetMonitorWorkarea
                (ppGVar4[lVar8],(int *)&local_c4,(int *)&local_c8,(int *)&local_b0,(int *)&local_b4)
      ;
      local_98 = ZEXT416(local_b4);
      local_78 = ZEXT416(local_b0);
      local_a8 = ZEXT416(local_c8);
      local_88 = ZEXT416(local_c4);
      glfwGetMonitorContentScale(ppGVar4[lVar8],&local_b8,&local_ac);
      iVar10 = (pIVar3->Monitors).Size;
      if (iVar10 == (pIVar3->Monitors).Capacity) {
        local_bc = local_b8;
        if (iVar10 == 0) {
          iVar2 = 8;
        }
        else {
          iVar2 = iVar10 / 2 + iVar10;
        }
        iVar9 = iVar10 + 1;
        if (iVar10 + 1 < iVar2) {
          iVar9 = iVar2;
        }
        pIVar7 = (ImGuiPlatformMonitor *)ImGui::MemAlloc((long)iVar9 * 0x24);
        pIVar5 = (pIVar3->Monitors).Data;
        if (pIVar5 != (ImGuiPlatformMonitor *)0x0) {
          memcpy(pIVar7,pIVar5,(long)(pIVar3->Monitors).Size * 0x24);
          ImGui::MemFree((pIVar3->Monitors).Data);
        }
        (pIVar3->Monitors).Data = pIVar7;
        (pIVar3->Monitors).Capacity = iVar9;
        iVar10 = (pIVar3->Monitors).Size;
        fVar11 = local_bc;
      }
      else {
        pIVar7 = (pIVar3->Monitors).Data;
        fVar11 = local_b8;
      }
      pIVar5 = pIVar7 + iVar10;
      (pIVar5->MainPos).x = (float)(int)local_58._0_4_;
      (pIVar5->MainPos).y = (float)(int)local_68._0_4_;
      (pIVar5->MainSize).x = (float)(int)local_48;
      (pIVar5->MainSize).y = (float)(int)((ulong)local_48 >> 0x20);
      pIVar1 = &pIVar7[iVar10].WorkPos;
      pIVar1->x = (float)(int)local_88._0_4_;
      pIVar1->y = (float)(int)local_a8._0_4_;
      pIVar1[1].x = (float)(int)local_78._0_4_;
      pIVar1[1].y = (float)(int)local_98._0_4_;
      pIVar7[iVar10].DpiScale = fVar11;
      (pIVar3->Monitors).Size = (pIVar3->Monitors).Size + 1;
      lVar8 = lVar8 + 1;
    } while (lVar8 < local_c0);
  }
  g_WantUpdateMonitors = 1;
  return;
}

Assistant:

static void ImGui_ImplGlfw_UpdateMonitors()
{
    ImGuiPlatformIO& platform_io = ImGui::GetPlatformIO();
    int monitors_count = 0;
    GLFWmonitor** glfw_monitors = glfwGetMonitors(&monitors_count);
    platform_io.Monitors.resize(0);
    for (int n = 0; n < monitors_count; n++)
    {
        ImGuiPlatformMonitor monitor;
        int x, y;
        glfwGetMonitorPos(glfw_monitors[n], &x, &y);
        const GLFWvidmode* vid_mode = glfwGetVideoMode(glfw_monitors[n]);
#if GLFW_HAS_MONITOR_WORK_AREA
        monitor.MainPos = ImVec2((float)x, (float)y);
        monitor.MainSize = ImVec2((float)vid_mode->width, (float)vid_mode->height);
        int w, h;
        glfwGetMonitorWorkarea(glfw_monitors[n], &x, &y, &w, &h);
        monitor.WorkPos = ImVec2((float)x, (float)y);;
        monitor.WorkSize = ImVec2((float)w, (float)h);
#else
        monitor.MainPos = monitor.WorkPos = ImVec2((float)x, (float)y);
        monitor.MainSize = monitor.WorkSize = ImVec2((float)vid_mode->width, (float)vid_mode->height);
#endif
#if GLFW_HAS_PER_MONITOR_DPI
        // Warning: the validity of monitor DPI information on Windows depends on the application DPI awareness settings, which generally needs to be set in the manifest or at runtime.
        float x_scale, y_scale;
        glfwGetMonitorContentScale(glfw_monitors[n], &x_scale, &y_scale);
        monitor.DpiScale = x_scale;
#endif
        platform_io.Monitors.push_back(monitor);
    }
    g_WantUpdateMonitors = false;
}